

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

ssl_open_record_t __thiscall
bssl::ssl_open_app_data
          (bssl *this,SSL *ssl,Span<unsigned_char> *out,size_t *out_consumed,uint8_t *out_alert,
          Span<unsigned_char> in)

{
  bool bVar1;
  ssl_open_record_t sVar2;
  
  out->data_ = (uchar *)0x0;
  bVar1 = check_read_error((SSL *)this);
  if (bVar1) {
    sVar2 = (**(code **)(*(long *)this + 0x40))(this,ssl,out,out_consumed,out_alert);
    if (sVar2 != ssl_open_record_error) {
      return sVar2;
    }
    ssl_set_read_error((SSL *)this);
  }
  else {
    *(undefined1 *)out_consumed = 0;
  }
  return ssl_open_record_error;
}

Assistant:

ssl_open_record_t ssl_open_app_data(SSL *ssl, Span<uint8_t> *out,
                                    size_t *out_consumed, uint8_t *out_alert,
                                    Span<uint8_t> in) {
  *out_consumed = 0;
  if (!check_read_error(ssl)) {
    *out_alert = 0;
    return ssl_open_record_error;
  }
  auto ret = ssl->method->open_app_data(ssl, out, out_consumed, out_alert, in);
  if (ret == ssl_open_record_error) {
    ssl_set_read_error(ssl);
  }
  return ret;
}